

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition_search.c
# Opt level: O0

void prune_4_partition_using_split_info
               (AV1_COMP *cpi,MACROBLOCK *x,PartitionSearchState *part_search_state,
               int *part4_search_allowed)

{
  long in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  int idx;
  RECT_PART_TYPE i;
  int num_win_thresh;
  int num_child_rect_win [2];
  PART4_TYPES cur_part [2];
  int local_3c;
  int local_38;
  byte local_31;
  int local_2c [2];
  byte local_22 [2];
  long local_20;
  long local_18;
  long local_10;
  long local_8;
  
  local_22[0] = 0;
  local_22[1] = 1;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  memset(local_2c,0,8);
  if (((0xff - *(int *)(local_10 + 0x4208)) * 3) / 0xff + 1 < 3) {
    local_3c = ((0xff - *(int *)(local_10 + 0x4208)) * 3) / 0xff + 1;
  }
  else {
    local_3c = 3;
  }
  for (local_31 = 0; local_31 < 2; local_31 = local_31 + 1) {
    if ((*(int *)(local_8 + 0x609b8) != 0) &&
       (*(int *)(local_20 + (ulong)local_22[local_31] * 4) != 0)) {
      for (local_38 = 0; local_38 < 4; local_38 = local_38 + 1) {
        local_2c[local_31] =
             (uint)(*(int *)(local_18 + 0x34 + (long)local_38 * 8 + (ulong)local_31 * 4) != 0) +
             local_2c[local_31];
      }
      if (local_2c[local_31] < local_3c) {
        *(undefined4 *)(local_20 + (ulong)local_22[local_31] * 4) = 0;
      }
    }
  }
  return;
}

Assistant:

static void prune_4_partition_using_split_info(
    AV1_COMP *const cpi, MACROBLOCK *x, PartitionSearchState *part_search_state,
    int part4_search_allowed[NUM_PART4_TYPES]) {
  PART4_TYPES cur_part[NUM_PART4_TYPES] = { HORZ4, VERT4 };
  // Count of child blocks in which HORZ or VERT partition has won
  int num_child_rect_win[NUM_RECT_PARTS] = { 0, 0 };
  // Prune HORZ4/VERT4 partitions based on number of HORZ/VERT winners of
  // split partiitons.
  // Conservative pruning for high quantizers.
  const int num_win_thresh = AOMMIN(3 * (MAXQ - x->qindex) / MAXQ + 1, 3);

  for (RECT_PART_TYPE i = HORZ; i < NUM_RECT_PARTS; i++) {
    if (!(cpi->sf.part_sf.prune_ext_part_using_split_info &&
          part4_search_allowed[cur_part[i]]))
      continue;
    // Loop over split partitions.
    // Get rectangular partitions winner info of split partitions.
    for (int idx = 0; idx < SUB_PARTITIONS_SPLIT; idx++)
      num_child_rect_win[i] +=
          (part_search_state->split_part_rect_win[idx].rect_part_win[i]) ? 1
                                                                         : 0;
    if (num_child_rect_win[i] < num_win_thresh) {
      part4_search_allowed[cur_part[i]] = 0;
    }
  }
}